

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

isoent * isoent_new(isofile *file)

{
  mode_t mVar1;
  isofile *in_RDI;
  isoent *isoent;
  isoent *local_8;
  
  local_8 = (isoent *)calloc(1,0xf0);
  if (local_8 == (isoent *)0x0) {
    local_8 = (isoent *)0x0;
  }
  else {
    local_8->file = in_RDI;
    (local_8->children).first = (isoent *)0x0;
    (local_8->children).last = &(local_8->children).first;
    __archive_rb_tree_init(&local_8->rbtree,&isoent_new::rb_ops);
    (local_8->subdirs).first = (isoent *)0x0;
    (local_8->subdirs).last = &(local_8->subdirs).first;
    (local_8->extr_rec_list).first = (extr_rec *)0x0;
    (local_8->extr_rec_list).last = &(local_8->extr_rec_list).first;
    (local_8->extr_rec_list).current = (extr_rec *)0x0;
    mVar1 = archive_entry_filetype(in_RDI->entry);
    if (mVar1 == 0x4000) {
      local_8->field_0xe8 = local_8->field_0xe8 & 0xfd | 2;
    }
  }
  return local_8;
}

Assistant:

static struct isoent *
isoent_new(struct isofile *file)
{
	struct isoent *isoent;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node, isoent_cmp_key,
	};

	isoent = calloc(1, sizeof(*isoent));
	if (isoent == NULL)
		return (NULL);
	isoent->file = file;
	isoent->children.first = NULL;
	isoent->children.last = &(isoent->children.first);
	__archive_rb_tree_init(&(isoent->rbtree), &rb_ops);
	isoent->subdirs.first = NULL;
	isoent->subdirs.last = &(isoent->subdirs.first);
	isoent->extr_rec_list.first = NULL;
	isoent->extr_rec_list.last = &(isoent->extr_rec_list.first);
	isoent->extr_rec_list.current = NULL;
	if (archive_entry_filetype(file->entry) == AE_IFDIR)
		isoent->dir = 1;

	return (isoent);
}